

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentType.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::EnvironmentType::EnvironmentType(EnvironmentType *this)

{
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EnvironmentType_00216e68;
  this->m_ui8EntityKind = '\x04';
  this->m_ui8Domain = '\0';
  this->m_ui16Class = 0;
  this->m_ui8Category = '\0';
  this->m_ui8Category = '\0';
  this->m_ui8SubCategory = '\0';
  this->m_ui8Specific = '\0';
  this->m_ui8Extra = '\0';
  return;
}

Assistant:

EnvironmentType::EnvironmentType() :
    m_ui8EntityKind( Environmental ),
    m_ui8Domain( 0 ),
    m_ui16Class( 0 ),
    m_ui8Category( 0 ),
    m_ui8SubCategory( 0 ),
    m_ui8Specific( 0 ),
    m_ui8Extra( 0 )
{
}